

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuApp.cpp
# Opt level: O3

void __thiscall tcu::App::cleanup(App *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestSessionExecutor *this_00;
  TestContext *pTVar2;
  pointer pcVar3;
  
  this_00 = this->m_testExecutor;
  if (this_00 != (TestSessionExecutor *)0x0) {
    TestSessionExecutor::~TestSessionExecutor(this_00);
  }
  operator_delete(this_00,0xa8);
  if (this->m_testRoot != (TestPackageRoot *)0x0) {
    (*(this->m_testRoot->super_TestNode)._vptr_TestNode[1])();
  }
  pTVar2 = this->m_testCtx;
  if (pTVar2 != (TestContext *)0x0) {
    pcVar3 = (pTVar2->m_testResultDesc)._M_dataplus._M_p;
    paVar1 = &(pTVar2->m_testResultDesc).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
  }
  operator_delete(pTVar2,0x60);
  if (this->m_crashHandler != (qpCrashHandler *)0x0) {
    qpCrashHandler_destroy(this->m_crashHandler);
  }
  if (this->m_watchDog != (qpWatchDog *)0x0) {
    qpWatchDog_destroy(this->m_watchDog);
    return;
  }
  return;
}

Assistant:

void App::cleanup (void)
{
	delete m_testExecutor;
	delete m_testRoot;
	delete m_testCtx;

	if (m_crashHandler)
		qpCrashHandler_destroy(m_crashHandler);

	if (m_watchDog)
		qpWatchDog_destroy(m_watchDog);
}